

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RationalNum.cpp
# Opt level: O0

void __thiscall RationalNum::simplify(RationalNum *this)

{
  longlong local_20;
  longlong tempD;
  longlong tempN;
  RationalNum *this_local;
  
  tempD = this->numerator;
  local_20 = this->denominator;
  tempN = (longlong)this;
  simplifyFun(&tempD,&local_20);
  setNumerator(this,tempD);
  setDenominator(this,local_20);
  return;
}

Assistant:

void RationalNum::simplify() {
    long long int tempN = numerator;
    long long int tempD = denominator;
    simplifyFun(tempN, tempD);
    setNumerator(tempN);
    setDenominator(tempD);
}